

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging_tests.c
# Opt level: O0

TestSuite * highly_nested_test_suite(void)

{
  TestSuite *pTVar1;
  TestSuite *nesting;
  TestSuite *suite;
  int i;
  TestSuite *local_10;
  int local_4;
  
  local_10 = (TestSuite *)
             create_named_test_suite_
                       ("highly_nested_test_suite",
                        "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
                        ,0x14);
  add_test_(local_10,"highly_nested_test_suite_should_still_complete",
            &CgreenSpec__default__highly_nested_test_suite_should_still_complete__);
  for (local_4 = 0; local_4 < 1000; local_4 = local_4 + 1) {
    pTVar1 = (TestSuite *)
             create_named_test_suite_
                       ("highly_nested_test_suite",
                        "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
                        ,0x17);
    add_suite_(pTVar1,"suite",local_10);
    local_10 = pTVar1;
  }
  return local_10;
}

Assistant:

TestSuite *highly_nested_test_suite(void) {
    int i;
    TestSuite *suite = create_test_suite();
    add_test(suite, highly_nested_test_suite_should_still_complete);
    for (i = 0; i < 1000; i++) {
        TestSuite *nesting = create_test_suite();
        add_suite(nesting, suite);
        suite = nesting;
    }
    return suite;
}